

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3FuncDefInsert(FuncDefHash *pHash,FuncDef *pDef)

{
  int nFunc;
  FuncDef *pFVar1;
  int h_00;
  int h;
  u8 c1;
  int nName;
  FuncDef *pOther;
  FuncDef *pDef_local;
  FuncDefHash *pHash_local;
  
  nFunc = sqlite3Strlen30(pDef->zName);
  h_00 = (int)((uint)""[(byte)*pDef->zName] + nFunc) % 0x17;
  pFVar1 = functionSearch(pHash,h_00,pDef->zName,nFunc);
  if (pFVar1 == (FuncDef *)0x0) {
    pDef->pNext = (FuncDef *)0x0;
    pDef->pHash = pHash->a[h_00];
    pHash->a[h_00] = pDef;
  }
  else {
    pDef->pNext = pFVar1->pNext;
    pFVar1->pNext = pDef;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3FuncDefInsert(
  FuncDefHash *pHash,  /* The hash table into which to insert */
  FuncDef *pDef        /* The function definition to insert */
){
  FuncDef *pOther;
  int nName = sqlite3Strlen30(pDef->zName);
  u8 c1 = (u8)pDef->zName[0];
  int h = (sqlite3UpperToLower[c1] + nName) % ArraySize(pHash->a);
  pOther = functionSearch(pHash, h, pDef->zName, nName);
  if( pOther ){
    assert( pOther!=pDef && pOther->pNext!=pDef );
    pDef->pNext = pOther->pNext;
    pOther->pNext = pDef;
  }else{
    pDef->pNext = 0;
    pDef->pHash = pHash->a[h];
    pHash->a[h] = pDef;
  }
}